

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O0

void __thiscall
BitCount_PopCountULongLong_Test::BitCount_PopCountULongLong_Test
          (BitCount_PopCountULongLong_Test *this)

{
  BitCount_PopCountULongLong_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BitCount_PopCountULongLong_Test_0031a3f8;
  return;
}

Assistant:

TEST (BitCount, PopCountULongLong) {
    std::uint64_t bitmap = 0;
    EXPECT_EQ (0U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xFF00;
    EXPECT_EQ (8U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xFFFFFFFFFFFFFFFF;
    EXPECT_EQ (64U, pstore::bit_count::pop_count (bitmap));
}